

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

void lj_lex_cleanup(lua_State *L,LexState *ls)

{
  uint32_t uVar1;
  BCInsLine *pBVar2;
  VarInfo *pVVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(L->glref).ptr32;
  pBVar2 = ls->bcstack;
  lVar5 = (ulong)ls->sizebcstack * 8;
  *(int *)(uVar6 + 0x50) = *(int *)(uVar6 + 0x50) - (int)lVar5;
  *(long *)(uVar6 + 0x90) = *(long *)(uVar6 + 0x90) + lVar5;
  (**(code **)(uVar6 + 0x40))(*(undefined8 *)(uVar6 + 0x48),pBVar2,lVar5,0);
  pVVar3 = ls->vstack;
  lVar5 = (ulong)ls->sizevstack * 0x10;
  *(int *)(uVar6 + 0x50) = *(int *)(uVar6 + 0x50) - (int)lVar5;
  *(long *)(uVar6 + 0x90) = *(long *)(uVar6 + 0x90) + lVar5;
  (**(code **)(uVar6 + 0x40))(*(undefined8 *)(uVar6 + 0x48),pVVar3,lVar5,0);
  uVar1 = (ls->sb).b.ptr32;
  uVar4 = (ls->sb).e.ptr32 - uVar1;
  *(int *)(uVar6 + 0x50) = *(int *)(uVar6 + 0x50) - uVar4;
  *(long *)(uVar6 + 0x90) = *(long *)(uVar6 + 0x90) + (ulong)uVar4;
  (**(code **)(uVar6 + 0x40))(*(undefined8 *)(uVar6 + 0x48),uVar1,(ulong)uVar4,0);
  return;
}

Assistant:

void lj_lex_cleanup(lua_State *L, LexState *ls)
{
  global_State *g = G(L);
  lj_mem_freevec(g, ls->bcstack, ls->sizebcstack, BCInsLine);
  lj_mem_freevec(g, ls->vstack, ls->sizevstack, VarInfo);
  lj_buf_free(g, &ls->sb);
}